

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_regex.hpp
# Opt level: O2

void __thiscall duckdb_re2::Regex::Regex(Regex *this,char *pattern,RegexOptions options)

{
  allocator local_31;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,pattern,&local_31);
  Regex(this,&local_30,NONE);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

explicit Regex(const char *pattern, RegexOptions options = RegexOptions::NONE) : Regex(std::string(pattern)) {
	}